

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout.cpp
# Opt level: O1

int __thiscall ncnn::Dropout::forward_inplace(Dropout *this,Mat *bottom_top_blob)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  
  if ((this->scale != 1.0) && (iVar1 = bottom_top_blob->c, 0 < (long)iVar1)) {
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    pvVar5 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    lVar6 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar7 = 0;
        do {
          *(float *)((long)pvVar5 + uVar7 * 4) = this->scale * *(float *)((long)pvVar5 + uVar7 * 4);
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
      lVar6 = lVar6 + 1;
      pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
    } while (lVar6 != iVar1);
  }
  return 0;
}

Assistant:

int Dropout::forward_inplace(Mat& bottom_top_blob) const
{
    if (scale == 1.f)
    {
        return 0;
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            ptr[i] = ptr[i] * scale;
        }
    }

    return 0;
}